

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O3

void __thiscall
perf::suite::suite(suite *this,
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_>_>
                  *cases,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer ppVar4;
  undefined8 uVar5;
  pointer name_00;
  _Any_data _Stack_48;
  code *local_38;
  
  (this->m_cases).super__Vector_base<perf::perf_case,_std::allocator<perf::perf_case>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cases).super__Vector_base<perf::perf_case,_std::allocator<perf::perf_case>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cases).super__Vector_base<perf::perf_case,_std::allocator<perf::perf_case>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_name).field_2 + 8) = uVar5;
  }
  else {
    (this->m_name)._M_dataplus._M_p = pcVar3;
    (this->m_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  ppVar4 = (cases->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (name_00 = (cases->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; name_00 != ppVar4;
      name_00 = name_00 + 1) {
    std::function<bool_()>::function((function<bool_()> *)&_Stack_48,&name_00->second);
    add_case(this,&name_00->first,(perf_func *)&_Stack_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&_Stack_48,&_Stack_48,__destroy_functor);
    }
  }
  return;
}

Assistant:

explicit suite(const std::vector<std::pair<std::string, perf_func>> &cases, std::string name = "PerfSuite") : m_name(std::move(name))
        {
            for (const auto &c : cases)
                add_case(c.first, c.second);
        }